

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

int __thiscall
gl4cts::TextureParameterQueriesTestCase::init
          (TextureParameterQueriesTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  int local_1c;
  
  pvVar3 = &this->mSupportedTargets;
  local_1c = 0xde1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  local_1c = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  local_1c = 0x8513;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  local_1c = 0x9009;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  local_1c = 0x806f;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  local_1c = 0x84f5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture2");
  pvVar3 = &this->mNotSupportedTargets;
  if (bVar1) {
    local_1c = 0xde0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
    local_1c = 0x8c18;
  }
  else {
    local_1c = 0xde0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
    local_1c = 0x8c18;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
    local_1c = 0x9100;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
    local_1c = 0x9102;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar3,&local_1c);
  return (int)pvVar2;
}

Assistant:

void TextureParameterQueriesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	}
	else
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	}
}